

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

void __thiscall VkSpecParser::skip(VkSpecParser *this)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView local_58;
  QStringView local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_48 = (QStringView)QXmlStreamReader::name();
  QStringView::toString((QString *)&local_38,&local_48);
  do {
    do {
      cVar1 = QXmlStreamReader::atEnd();
      if (cVar1 != '\0') goto LAB_00103452;
      QXmlStreamReader::readNext();
      bVar2 = QXmlStreamReader::isEndElement(&this->m_reader);
    } while (!bVar2);
    QVar3 = (QStringView)QXmlStreamReader::name();
    local_58.m_size = local_38.size;
    local_58.m_data = local_38.ptr;
    local_48 = QVar3;
    bVar2 = comparesEqual(&local_48,&local_58);
  } while (!bVar2);
LAB_00103452:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::skip()
{
    QString tag = m_reader.name().toString();
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
    }
}